

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerSafe::GetBbrDataset
          (CommissionerSafe *this,Handler<BbrDataset> *aHandler,uint16_t aDatasetFlags)

{
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  CommissionerSafe *local_48;
  _Any_data local_40;
  long local_30;
  undefined8 uStack_28;
  uint16_t local_20;
  
  local_48 = this;
  std::function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)>::function
            ((function<void_(const_ot::commissioner::BbrDataset_*,_ot::commissioner::Error)> *)
             &local_40,aHandler);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_20 = aDatasetFlags;
  local_68._M_unused._M_object = operator_new(0x30);
  *(CommissionerSafe **)local_68._M_unused._0_8_ = local_48;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x20) = uStack_28;
  if (local_30 != 0) {
    *(void **)((long)local_68._M_unused._0_8_ + 8) = local_40._M_unused._M_object;
    *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x10) = local_40._8_8_;
    *(long *)((long)local_68._M_unused._0_8_ + 0x18) = local_30;
    local_30 = 0;
    uStack_28 = 0;
  }
  *(uint16_t *)((long)local_68._M_unused._0_8_ + 0x28) = aDatasetFlags;
  pcStack_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:261:22)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:261:22)>
             ::_M_manager;
  PushAsyncRequest(this,(AsyncRequest *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return;
}

Assistant:

void CommissionerSafe::GetBbrDataset(Handler<BbrDataset> aHandler, uint16_t aDatasetFlags)
{
    PushAsyncRequest([=]() { mImpl->GetBbrDataset(aHandler, aDatasetFlags); });
}